

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O0

size_t io::
       read_all<io::posix::file,io::net::dynamic_vector_buffer<unsigned_char,std::allocator<unsigned_char>>,void>
                 (file *stream,
                 dynamic_vector_buffer<unsigned_char,_std::allocator<unsigned_char>_> *b,
                 error_code *ec)

{
  size_t __lhs;
  bool bVar1;
  error_code local_38;
  size_t local_28;
  size_t bytes_read;
  error_code *ec_local;
  dynamic_vector_buffer<unsigned_char,_std::allocator<unsigned_char>_> *b_local;
  file *stream_local;
  
  bytes_read = (size_t)ec;
  ec_local = (error_code *)b;
  b_local = (dynamic_vector_buffer<unsigned_char,_std::allocator<unsigned_char>_> *)stream;
  local_28 = net::
             read<io::posix::file,io::net::dynamic_vector_buffer<unsigned_char,std::allocator<unsigned_char>>,void>
                       (stream,b,ec);
  __lhs = bytes_read;
  std::error_code::error_code<io::net::stream_errc,void>(&local_38,eof);
  bVar1 = std::operator==((error_code *)__lhs,&local_38);
  if (bVar1) {
    std::error_code::clear((error_code *)bytes_read);
  }
  return local_28;
}

Assistant:

std::size_t read_all(SyncReadStream& stream, DynamicBuffer&& b, std::error_code& ec)
{
    std::size_t bytes_read = io::read(stream, std::forward<DynamicBuffer>(b), ec);
    if (ec == stream_errc::eof) {
        ec.clear();
    }
    return bytes_read;
}